

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lines.hpp
# Opt level: O0

void __thiscall
just::lines::
iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
::next_char(iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            *this)

{
  bool bVar1;
  reference pcVar2;
  iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  *this_local;
  
  if (((this->_at_end ^ 0xffU) & 1) == 0) {
    __assert_fail("!_at_end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/lines.hpp"
                  ,0x96,
                  "void just::lines::iterator<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::next_char() [InputIt = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, KeepNewlines = false]"
                 );
  }
  bVar1 = __gnu_cxx::operator!=(&this->_at,&this->_end);
  if (!bVar1) {
    __assert_fail("_at != _end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/lines.hpp"
                  ,0x97,
                  "void just::lines::iterator<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::next_char() [InputIt = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, KeepNewlines = false]"
                 );
  }
  pcVar2 = __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&this->_at);
  this->_last_char = *pcVar2;
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++(&this->_at);
  return;
}

Assistant:

void next_char()
      {
        assert(!_at_end);
        assert(_at != _end);

        _last_char = *_at;
        ++_at;
      }